

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_proxy_getPrototypeOf(JSContext *ctx,JSValue obj)

{
  int iVar1;
  JSProxyData *argv;
  JSValueUnion JVar2;
  uint uVar3;
  JSValue JVar4;
  JSValue v;
  JSValue method;
  JSValueUnion local_40;
  int64_t local_38;
  
  argv = get_proxy_method(ctx,(JSValue *)&local_40,obj,0x5f);
  if (argv == (JSProxyData *)0x0) goto LAB_0011d4ae;
  if ((int)local_38 == 3) {
    JVar4 = JS_GetPrototype(ctx,argv->target);
    return JVar4;
  }
  JVar4.tag = local_38;
  JVar4.u.float64 = local_40.float64;
  JVar4 = JS_CallFree(ctx,JVar4,argv->handler,1,&argv->target);
  JVar2 = JVar4.u;
  uVar3 = (uint)JVar4.tag;
  if (uVar3 == 6) {
    return JVar4;
  }
  if ((uVar3 == 2) || (uVar3 == 0xffffffff)) {
    iVar1 = JS_IsExtensible(ctx,argv->target);
    if (iVar1 < 0) {
      if ((0xfffffff4 < uVar3) && (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar4);
      }
      goto LAB_0011d4ae;
    }
    if (iVar1 != 0) {
      return JVar4;
    }
    v = JS_GetPrototype(ctx,argv->target);
    if ((int)v.tag == 6) {
      JS_FreeValue(ctx,JVar4);
      goto LAB_0011d4ae;
    }
    JS_FreeValue(ctx,v);
    if (v.u.ptr == JVar2.ptr) {
      return JVar4;
    }
  }
  if ((0xfffffff4 < uVar3) && (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar4);
  }
  JS_ThrowTypeError(ctx,"proxy: inconsistent prototype");
LAB_0011d4ae:
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_proxy_getPrototypeOf(JSContext *ctx, JSValueConst obj)
{
    JSProxyData *s;
    JSValue method, ret, proto1;
    int res;

    s = get_proxy_method(ctx, &method, obj, JS_ATOM_getPrototypeOf);
    if (!s)
        return JS_EXCEPTION;
    if (JS_IsUndefined(method))
        return JS_GetPrototype(ctx, s->target);
    ret = JS_CallFree(ctx, method, s->handler, 1, (JSValueConst *)&s->target);
    if (JS_IsException(ret))
        return ret;
    if (JS_VALUE_GET_TAG(ret) != JS_TAG_NULL &&
        JS_VALUE_GET_TAG(ret) != JS_TAG_OBJECT) {
        goto fail;
    }
    res = JS_IsExtensible(ctx, s->target);
    if (res < 0) {
        JS_FreeValue(ctx, ret);
        return JS_EXCEPTION;
    }
    if (!res) {
        /* check invariant */
        proto1 = JS_GetPrototype(ctx, s->target);
        if (JS_IsException(proto1)) {
            JS_FreeValue(ctx, ret);
            return JS_EXCEPTION;
        }
        if (JS_VALUE_GET_OBJ(proto1) != JS_VALUE_GET_OBJ(ret)) {
            JS_FreeValue(ctx, proto1);
        fail:
            JS_FreeValue(ctx, ret);
            return JS_ThrowTypeError(ctx, "proxy: inconsistent prototype");
        }
        JS_FreeValue(ctx, proto1);
    }
    return ret;
}